

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRStereoNode::setCameraMatrix(VRStereoNode *this,VRDataIndex *renderState,VREyePosition eye)

{
  bool bVar1;
  VRAnyCoreType t;
  VRError *this_00;
  allocator<char> aStack_1c8;
  allocator<char> local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  int local_1c4;
  string local_1c0;
  VRMatrix4 local_1a0;
  VRMatrix4 cameraMatrix;
  VRMatrix4 local_110;
  string local_c8;
  string local_a8;
  VRMatrix4 headMatrix;
  string local_40;
  
  VRMatrix4::VRMatrix4(&headMatrix);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraMatrix,"HeadMatrix",(allocator<char> *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"",(allocator<char> *)&local_110);
  bVar1 = VRDataIndex::exists(renderState,(string *)&cameraMatrix,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&cameraMatrix);
  if (!bVar1) {
    this_00 = (VRError *)__cxa_allocate_exception(0xa8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cameraMatrix,
               "VRStereoNode cannot find HeadMatrix in the current RenderState",&local_1c5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,
               "The display graph should include a VRHeadTrackingNode or a VRLookAtNode or some other method of defining a HeadMatrix before reaching the VRStereoNode."
               ,&local_1c6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
               ,&local_1c7);
    local_1c4 = 0x70;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,
               "void MinVR::VRStereoNode::setCameraMatrix(VRDataIndex *, VREyePosition)",&aStack_1c8
              );
    VRError::VRError(this_00,(string *)&cameraMatrix,(string *)&local_1a0,(string *)&local_110,
                     &local_1c4,&local_1c0);
    __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"HeadMatrix",(allocator<char> *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"",(allocator<char> *)&local_1c0);
  t = VRDataIndex::getValue(renderState,(string *)&local_1a0,&local_c8,true);
  VRMatrix4::VRMatrix4(&cameraMatrix,t);
  VRMatrix4::operator=(&headMatrix,&cameraMatrix);
  VRMatrix4::~VRMatrix4(&cameraMatrix);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_1a0);
  VRMatrix4::VRMatrix4(&cameraMatrix,&headMatrix);
  if (eye == Right) {
    VRVector3::VRVector3((VRVector3 *)&local_1c0,this->_iod * 0.5,0.0,0.0);
    VRMatrix4::translation(&local_110,(VRVector3 *)&local_1c0);
    operator*(&local_1a0,&cameraMatrix,&local_110);
    VRMatrix4::operator=(&cameraMatrix,&local_1a0);
  }
  else {
    if (eye != Left) goto LAB_00134570;
    VRVector3::VRVector3((VRVector3 *)&local_1c0,this->_iod * -0.5,0.0,0.0);
    VRMatrix4::translation(&local_110,(VRVector3 *)&local_1c0);
    operator*(&local_1a0,&cameraMatrix,&local_110);
    VRMatrix4::operator=(&cameraMatrix,&local_1a0);
  }
  VRMatrix4::~VRMatrix4(&local_1a0);
  VRMatrix4::~VRMatrix4(&local_110);
  VRVector3::~VRVector3((VRVector3 *)&local_1c0);
LAB_00134570:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CameraMatrix",(allocator<char> *)&local_110);
  VRDataIndex::addData
            (&local_40,renderState,(string *)&local_1a0,&cameraMatrix.super_VRFloatArrayConvertible)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_1a0);
  VRMatrix4::~VRMatrix4(&cameraMatrix);
  VRMatrix4::~VRMatrix4(&headMatrix);
  return;
}

Assistant:

void VRStereoNode::setCameraMatrix(VRDataIndex *renderState, VREyePosition eye)
{

    // This should be set by a HeadTrackingNode or a LookAtNode before reaching
    // this StereoNode
	VRMatrix4 headMatrix;
	if (renderState->exists("HeadMatrix")) {
		headMatrix = renderState->getValue("HeadMatrix");

	} else {
    VRERROR("VRStereoNode cannot find HeadMatrix in the current RenderState",
            "The display graph should include a VRHeadTrackingNode or a "
            "VRLookAtNode or some other method of defining a HeadMatrix "
            "before reaching the VRStereoNode.");
  }

  VRMatrix4 cameraMatrix = headMatrix;
  if (eye == Left) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(-_iod / 2.0f, 0, 0));
	} else if (eye == Right) {
    cameraMatrix = cameraMatrix * VRMatrix4::translation(VRVector3(_iod / 2.0f, 0, 0));
	}

	renderState->addData("CameraMatrix", cameraMatrix);
}